

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
::_negative_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
  *pIVar1;
  uint uVar2;
  uint uVar3;
  Dimension DVar4;
  undefined4 uVar5;
  long lVar6;
  bool bVar7;
  ID_index IVar8;
  ID_index IVar9;
  ulong uVar10;
  long lVar11;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
  *pIVar12;
  long lVar13;
  long lVar14;
  anon_class_1_0_00000001 local_43;
  anon_class_1_0_00000001 local_42;
  anon_class_1_0_00000001 local_41;
  uint local_40;
  Index local_3c;
  anon_class_8_1_e4bd5e45 local_38;
  
  lVar6 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  lVar13 = (ulong)columnIndex1 * 0x40;
  uVar2 = *(uint *)(lVar6 + 0x18 + lVar13);
  lVar14 = (ulong)columnIndex2 * 0x40;
  local_40 = *(uint *)(lVar6 + 0x18 + lVar14);
  uVar10 = (ulong)local_40;
  local_38.targetColumn._0_4_ = uVar2;
  local_3c = columnIndex1;
  if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar7 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_38,&local_40);
  lVar6 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  if (bVar7) {
    lVar11 = uVar10 * 0x40;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar6 + lVar11);
    uVar3 = *(uint *)(lVar6 + 0x14 + lVar11);
    pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)((ulong)uVar2 * 0x40 + lVar6);
    local_38.targetColumn = pIVar1;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar12,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar7) {
      IVar8 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar12->super_Chain_column_option).pivot_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar8;
      DVar4 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar12->super_Column_dimension_option).dim_;
      (pIVar12->super_Column_dimension_option).dim_ = DVar4;
    }
    uVar2 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar3 != uVar2) {
      lVar6 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
      uVar5 = *(undefined4 *)(lVar6 + (ulong)uVar3 * 4);
      *(undefined4 *)(lVar6 + (ulong)uVar3 * 4) = *(undefined4 *)(lVar6 + (ulong)uVar2 * 4);
      *(undefined4 *)(lVar6 + (ulong)uVar2 * 4) = uVar5;
    }
    lVar6 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar6 + lVar14);
    IVar8 = *(ID_index *)(lVar6 + 0x14 + lVar14);
    pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)(lVar13 + lVar6);
    local_38.targetColumn = pIVar1;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar12,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar7) {
      IVar9 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar12->super_Chain_column_option).pivot_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar9;
      DVar4 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar12->super_Column_dimension_option).dim_;
      (pIVar12->super_Column_dimension_option).dim_ = DVar4;
    }
    IVar9 = (pIVar1->super_Chain_column_option).pivot_;
    if (IVar8 == IVar9) {
      return local_3c;
    }
  }
  else {
    lVar11 = (ulong)uVar2 * 0x40;
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar6 + lVar11);
    uVar2 = *(uint *)(lVar6 + 0x14 + lVar11);
    pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)(uVar10 * 0x40 + lVar6);
    local_3c = columnIndex2;
    local_38.targetColumn = pIVar1;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar12,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar7) {
      IVar8 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar12->super_Chain_column_option).pivot_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar8;
      DVar4 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar12->super_Column_dimension_option).dim_;
      (pIVar12->super_Column_dimension_option).dim_ = DVar4;
    }
    uVar3 = (pIVar1->super_Chain_column_option).pivot_;
    if (uVar2 != uVar3) {
      lVar6 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
      uVar5 = *(undefined4 *)(lVar6 + (ulong)uVar2 * 4);
      *(undefined4 *)(lVar6 + (ulong)uVar2 * 4) = *(undefined4 *)(lVar6 + (ulong)uVar3 * 4);
      *(undefined4 *)(lVar6 + (ulong)uVar3 * 4) = uVar5;
    }
    lVar6 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
    pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
              *)(lVar6 + lVar13);
    IVar8 = *(ID_index *)(lVar6 + 0x14 + lVar13);
    pIVar12 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_true>_>_>
               *)(lVar14 + lVar6);
    local_38.targetColumn = pIVar1;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_acc___atrix::Column_types)7,false,false,false,false,false,false,true>>::Matrix_column_tag,1u>_false>___1_>
                      (pIVar12,pIVar1,(anon_class_1_0_00000001 *)&local_40,&local_38,&local_41,
                       &local_42,&local_43);
    if (bVar7) {
      IVar9 = (pIVar1->super_Chain_column_option).pivot_;
      (pIVar1->super_Chain_column_option).pivot_ = (pIVar12->super_Chain_column_option).pivot_;
      (pIVar12->super_Chain_column_option).pivot_ = IVar9;
      DVar4 = (pIVar1->super_Column_dimension_option).dim_;
      (pIVar1->super_Column_dimension_option).dim_ = (pIVar12->super_Column_dimension_option).dim_;
      (pIVar12->super_Column_dimension_option).dim_ = DVar4;
    }
    IVar9 = (pIVar1->super_Chain_column_option).pivot_;
    if (IVar8 == IVar9) {
      return local_3c;
    }
  }
  lVar6 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
  uVar5 = *(undefined4 *)(lVar6 + (ulong)IVar8 * 4);
  *(undefined4 *)(lVar6 + (ulong)IVar8 * 4) = *(undefined4 *)(lVar6 + (ulong)IVar9 * 4);
  *(undefined4 *)(lVar6 + (ulong)IVar9 * 4) = uVar5;
  return local_3c;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_negative_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  Index pairedIndex1 = col1.get_paired_chain_index();
  Index pairedIndex2 = col2.get_paired_chain_index();

  bool hasSmallerBirth;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    hasSmallerBirth = (CP::birth(col1.get_pivot()) < CP::birth(col2.get_pivot()));
  } else {
    hasSmallerBirth = birthComp_(pairedIndex1, pairedIndex2);
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }

  if (hasSmallerBirth)
  {
    _matrix()->add_to(pairedIndex1, pairedIndex2);
    _matrix()->add_to(columnIndex1, columnIndex2);

    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::negative_transpose(col1.get_pivot(), col2.get_pivot());
    }

    return columnIndex1;
  }

  _matrix()->add_to(pairedIndex2, pairedIndex1);
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}